

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Benchmark::Benchmark::run<std::chrono::_V2::steady_clock>(Benchmark *this)

{
  Environment<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> EVar1;
  int iVar2;
  IContext *pIVar3;
  undefined4 extraout_var;
  IResultCapture *pIVar4;
  element_type *peVar5;
  Detail *this_00;
  iterator cfg_00;
  anon_class_24_3_fd67980c *fun;
  anon_class_24_3_b965e527 *fun_00;
  __normal_iterator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_*,_std::vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>_>
  in_R8;
  undefined1 local_2b8 [8];
  BenchmarkStats<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> stats;
  undefined1 local_1a0 [8];
  SampleAnalysis<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> analysis;
  undefined1 local_110 [8];
  CompleteType_t<FunctionReturnType<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ebu[P]libear_submodules_catch2_catch_hpp:7339:46)>_>
  samples;
  BenchmarkInfo info;
  undefined1 local_98 [8];
  CompleteType_t<FunctionReturnType<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ebu[P]libear_submodules_catch2_catch_hpp:7323:43)>_>
  plan;
  duration<double,_std::ratio<1L,_1000000000L>_> dStack_60;
  Environment<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> env;
  IConfigPtr cfg;
  Benchmark *this_local;
  
  pIVar3 = getCurrentContext();
  iVar2 = (*pIVar3->_vptr_IContext[4])();
  std::shared_ptr<const_Catch::IConfig>::shared_ptr
            ((shared_ptr<const_Catch::IConfig> *)&env.clock_cost.outliers.high_severe,
             (shared_ptr<const_Catch::IConfig> *)CONCAT44(extraout_var,iVar2));
  Detail::measure_environment<std::chrono::_V2::steady_clock>();
  pIVar4 = getResultCapture();
  (*pIVar4->_vptr_IResultCapture[6])(pIVar4,&this->name);
  info.clockCost = (double)&env.clock_cost.outliers.high_severe;
  user_code<Catch::Benchmark::Benchmark::run<std::chrono::_V2::steady_clock>()::_lambda()_1_>
            ((CompleteType_t<FunctionReturnType<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ebu[P]libear_submodules_catch2_catch_hpp:7323:43)>_>
              *)local_98,(Benchmark *)&info.clockCost,fun);
  std::__cxx11::string::string
            ((string *)
             &samples.
              super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&this->name);
  info.name.field_2._8_8_ =
       std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>::count
                 ((duration<double,_std::ratio<1L,_1000000000L>_> *)&plan);
  info.estimatedDuration._0_4_ = local_98._0_4_;
  peVar5 = std::__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&env.clock_cost.outliers.high_severe);
  info.estimatedDuration._4_4_ = (*(peVar5->super_NonCopyable)._vptr_NonCopyable[0x16])();
  peVar5 = std::__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&env.clock_cost.outliers.high_severe);
  info.iterations = (*(peVar5->super_NonCopyable)._vptr_NonCopyable[0x18])();
  info._48_8_ = std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>::count(&dStack_60);
  info.clockResolution =
       std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>::count
                 ((duration<double,_std::ratio<1L,_1000000000L>_> *)
                  &env.clock_resolution.outliers.high_severe);
  pIVar4 = getResultCapture();
  (*pIVar4->_vptr_IResultCapture[7])
            (pIVar4,&samples.
                     super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  analysis.outlier_variance = (double)local_98;
  user_code<Catch::Benchmark::Benchmark::run<std::chrono::_V2::steady_clock>()::_lambda()_2_>
            ((CompleteType_t<FunctionReturnType<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ebu[P]libear_submodules_catch2_catch_hpp:7339:46)>_>
              *)local_110,(Benchmark *)&analysis.outlier_variance,fun_00);
  this_00 = (Detail *)
            std::__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator*((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&env.clock_cost.outliers.high_severe);
  cfg_00 = std::
           vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
           ::begin((vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
                    *)local_110);
  stats.outlierVariance =
       (double)std::
               vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
               ::end((vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
                      *)local_110);
  EVar1.clock_resolution.outliers._0_8_ = env.clock_resolution.mean.__r;
  EVar1.clock_resolution.mean.__r = dStack_60.__r;
  EVar1.clock_resolution.outliers.low_mild = env.clock_resolution.outliers.samples_seen;
  EVar1.clock_resolution.outliers.high_mild = env.clock_resolution.outliers.low_severe;
  EVar1.clock_resolution.outliers.high_severe = env.clock_resolution.outliers.low_mild;
  EVar1.clock_resolution._28_4_ = env.clock_resolution.outliers.high_mild;
  EVar1.clock_cost.mean.__r = (rep)env.clock_resolution._24_8_;
  EVar1.clock_cost.outliers._0_8_ = env.clock_cost.mean.__r;
  EVar1.clock_cost.outliers.low_mild = env.clock_cost.outliers.samples_seen;
  EVar1.clock_cost.outliers.high_mild = env.clock_cost.outliers.low_severe;
  EVar1.clock_cost.outliers.high_severe = env.clock_cost.outliers.low_mild;
  EVar1.clock_cost._28_4_ = env.clock_cost.outliers.high_mild;
  Detail::
  analyse<std::chrono::duration<double,std::ratio<1l,1000000000l>>,__gnu_cxx::__normal_iterator<std::chrono::duration<double,std::ratio<1l,1000000000l>>*,std::vector<std::chrono::duration<double,std::ratio<1l,1000000000l>>,std::allocator<std::chrono::duration<double,std::ratio<1l,1000000000l>>>>>>
            ((SampleAnalysis<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> *)
             local_1a0,this_00,(IConfig *)cfg_00._M_current,EVar1,
             (__normal_iterator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_*,_std::vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>_>
              )stats.outlierVariance,in_R8);
  BenchmarkInfo::BenchmarkInfo
            ((BenchmarkInfo *)local_2b8,
             (BenchmarkInfo *)
             &samples.
              super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
  ::vector((vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
            *)&stats.info.clockCost,
           (vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
            *)local_1a0);
  stats.mean.lower_bound = analysis.mean.lower_bound;
  stats.mean.upper_bound = analysis.mean.upper_bound;
  stats.samples.
  super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       analysis.samples.
       super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  stats.mean.point = analysis.mean.point;
  stats.standardDeviation.lower_bound = analysis.standard_deviation.lower_bound;
  stats.standardDeviation.upper_bound = analysis.standard_deviation.upper_bound;
  stats.mean.confidence_interval = analysis.mean.confidence_interval;
  stats.standardDeviation.point = analysis.standard_deviation.point;
  stats.outliers.low_mild = analysis.outliers.low_mild;
  stats.standardDeviation.confidence_interval = analysis.standard_deviation.confidence_interval;
  stats.outliers.samples_seen = analysis.outliers.samples_seen;
  stats.outliers.low_severe = analysis.outliers.low_severe;
  stats.outliers.high_severe = analysis.outliers.high_severe;
  stats._180_4_ = analysis._108_4_;
  pIVar4 = getResultCapture();
  (*pIVar4->_vptr_IResultCapture[8])(pIVar4,local_2b8);
  BenchmarkStats<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>::~BenchmarkStats
            ((BenchmarkStats<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> *)
             local_2b8);
  SampleAnalysis<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>::~SampleAnalysis
            ((SampleAnalysis<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> *)
             local_1a0);
  std::
  vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
  ::~vector((vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
             *)local_110);
  BenchmarkInfo::~BenchmarkInfo
            ((BenchmarkInfo *)
             &samples.
              super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ExecutionPlan<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>::~ExecutionPlan
            ((ExecutionPlan<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> *)local_98
            );
  std::shared_ptr<const_Catch::IConfig>::~shared_ptr
            ((shared_ptr<const_Catch::IConfig> *)&env.clock_cost.outliers.high_severe);
  return;
}

Assistant:

void run() {
                IConfigPtr cfg = getCurrentContext().getConfig();

                auto env = Detail::measure_environment<Clock>();

                getResultCapture().benchmarkPreparing(name);
                CATCH_TRY{
                    auto plan = user_code([&] {
                        return prepare<Clock>(*cfg, env);
                    });

                    BenchmarkInfo info {
                        name,
                        plan.estimated_duration.count(),
                        plan.iterations_per_sample,
                        cfg->benchmarkSamples(),
                        cfg->benchmarkResamples(),
                        env.clock_resolution.mean.count(),
                        env.clock_cost.mean.count()
                    };

                    getResultCapture().benchmarkStarting(info);

                    auto samples = user_code([&] {
                        return plan.template run<Clock>(*cfg, env);
                    });

                    auto analysis = Detail::analyse(*cfg, env, samples.begin(), samples.end());
                    BenchmarkStats<FloatDuration<Clock>> stats{ info, analysis.samples, analysis.mean, analysis.standard_deviation, analysis.outliers, analysis.outlier_variance };
                    getResultCapture().benchmarkEnded(stats);

                }